

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall
HEkkDualRHS::chooseMultiGlobal
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  int iVar2;
  long lVar3;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin_00;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin_01;
  long lVar4;
  HighsInt HVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  int in_ECX;
  undefined4 *in_RDX;
  long in_RSI;
  long *in_RDI;
  pair<double,_int> pVar11;
  uint i_2;
  double myWeight_1;
  double myInfeas_1;
  HighsInt iRow_1;
  HighsInt i_1;
  HighsInt end_1;
  HighsInt start_1;
  HighsInt section_1;
  double cutoffMerit_1;
  HighsInt randomStart_1;
  double myWeight;
  double myInfeas;
  HighsInt iRow;
  HighsInt end;
  HighsInt start;
  HighsInt section;
  double cutoffMerit;
  HighsInt randomStart;
  HighsInt numRow;
  vector<double,_std::allocator<double>_> *edge_weight;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> setP;
  HighsUInt chooseCHECK;
  HighsInt i;
  value_type *in_stack_fffffffffffffe48;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffe50;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  double in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  HighsInt in_stack_fffffffffffffe74;
  int iVar12;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffe80;
  int local_164;
  int local_160;
  uint local_144;
  int local_e0;
  int local_d4;
  double local_d0;
  HighsInt local_c4;
  int local_78;
  int local_6c;
  double local_68;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_40;
  uint local_24;
  int local_20;
  int local_1c;
  undefined4 *local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (HighsInt)((ulong)in_stack_fffffffffffffe58._M_current >> 0x20),
             (HighsInt)in_stack_fffffffffffffe58._M_current);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    *(undefined4 *)(local_10 + (long)local_20 * 4) = 0xffffffff;
  }
  local_24 = local_1c * 2;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x7992bd);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
            );
  lVar3 = *in_RDI;
  HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  if ((int)in_RDI[2] < 0) {
    lVar4 = in_RDI[2];
    HVar5 = HighsRandom::integer((HighsRandom *)in_stack_fffffffffffffe58._M_current,HVar5);
    local_68 = 0.0;
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      local_78 = HVar5;
      local_164 = -(int)lVar4;
      if (local_6c != 0) {
        local_160 = 0;
        local_78 = local_160;
        local_164 = HVar5;
      }
      for (; local_78 < local_164; local_78 = local_78 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_78);
        if (1e-50 < *pvVar6) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_78
                             );
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar3 + 0x2a20),
                              (long)local_78);
          if (local_68 * *pvVar6 < dVar1) {
            std::make_pair<double,int&>
                      ((double *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48);
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            sVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                    size(&local_40);
            if (local_24 <= sVar7) {
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )in_stack_fffffffffffffe48);
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )in_stack_fffffffffffffe48);
              begin._M_current._4_4_ = in_stack_fffffffffffffe64;
              begin._M_current._0_4_ = in_stack_fffffffffffffe60;
              pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        (begin,in_stack_fffffffffffffe58);
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         (size_type)in_stack_fffffffffffffe68);
              pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ::back(in_stack_fffffffffffffe50);
              local_68 = -pvVar8->first;
            }
          }
        }
      }
    }
  }
  else {
    if ((int)in_RDI[2] == 0) {
      local_c4 = 0;
    }
    else {
      local_c4 = HighsRandom::integer((HighsRandom *)in_stack_fffffffffffffe58._M_current,HVar5);
    }
    local_d0 = 0.0;
    for (local_d4 = 0; local_d4 < 2; local_d4 = local_d4 + 1) {
      if (local_d4 == 0) {
        in_stack_fffffffffffffe74 = (HighsInt)in_RDI[2];
        local_e0 = local_c4;
        iVar12 = (HighsInt)in_RDI[2];
      }
      else {
        local_e0 = 0;
        in_stack_fffffffffffffe74 = local_c4;
        iVar12 = local_c4;
      }
      for (; local_e0 < iVar12; local_e0 = local_e0 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_e0);
        iVar2 = *pvVar9;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar2);
        if (1e-50 < *pvVar6) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar2);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar3 + 0x2a20),
                              (long)iVar2);
          if (local_d0 * *pvVar6 < dVar1) {
            pVar11 = std::make_pair<double,int&>
                               ((double *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48
                               );
            in_stack_fffffffffffffe68 = pVar11.first;
            in_stack_fffffffffffffe64 = pVar11.second;
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            sVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                    size(&local_40);
            if (local_24 <= sVar7) {
              in_stack_fffffffffffffe58._M_current = (pair<double,_int> *)&local_40;
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )in_stack_fffffffffffffe48);
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )in_stack_fffffffffffffe48);
              begin_00._M_current._4_4_ = in_stack_fffffffffffffe64;
              begin_00._M_current._0_4_ = in_stack_fffffffffffffe60;
              pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        (begin_00,in_stack_fffffffffffffe58);
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         (size_type)in_stack_fffffffffffffe68);
              pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ::back(in_stack_fffffffffffffe50);
              local_d0 = -pvVar8->first;
            }
          }
        }
      }
    }
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             in_stack_fffffffffffffe48);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             in_stack_fffffffffffffe48);
  begin_01._M_current._4_4_ = in_stack_fffffffffffffe64;
  begin_01._M_current._0_4_ = in_stack_fffffffffffffe60;
  pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
            (begin_01,in_stack_fffffffffffffe58);
  sVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size
                    (&local_40);
  if (local_1c < (int)sVar7) {
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (size_type)in_stack_fffffffffffffe68);
  }
  sVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size
                    (&local_40);
  *local_18 = (int)sVar7;
  local_144 = 0;
  while( true ) {
    uVar10 = (ulong)local_144;
    sVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size
                      (&local_40);
    if (sVar7 <= uVar10) break;
    pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[](&local_40,(ulong)local_144);
    *(int *)(local_10 + (ulong)local_144 * 4) = pvVar8->second;
    local_144 = local_144 + 1;
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (HighsInt)((ulong)in_stack_fffffffffffffe58._M_current >> 0x20),
             (HighsInt)in_stack_fffffffffffffe58._M_current);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiGlobal(HighsInt* chIndex, HighsInt* chCount,
                                    HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;

  const HighsUInt chooseCHECK = chLimit * 2;
  vector<pair<double, int>> setP;
  setP.reserve(chooseCHECK);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        // Was
        //    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        // Continue
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  } else {
    // SPARSE Mode
    HighsInt randomStart;
    if (workCount) {
      randomStart = ekk_instance_.random_.integer(workCount);
    } else {
      // workCount = 0
      randomStart = 0;
    }
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        // Was
        //    for (HighsInt i = 0; i < workCount; i++) {
        // Continue
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  }

  // Store the setP
  pdqsort(setP.begin(), setP.end());
  if ((HighsInt)(setP.size()) > chLimit) setP.resize(chLimit);
  *chCount = setP.size();
  for (unsigned i = 0; i < setP.size(); i++) chIndex[i] = setP[i].second;
  analysis->simplexTimerStop(ChuzrDualClock);
}